

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

char __thiscall duckdb::Linenoise::Search(Linenoise *this,char c)

{
  EscapeSequence EVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  Linenoise *this_00;
  char in_SIL;
  Linenoise *in_RDI;
  bool bVar5;
  Linenoise *unaff_retaddr;
  EscapeSequence escape;
  Linenoise *in_stack_00000120;
  int in_stack_000001c0;
  Linenoise *in_stack_00000370;
  Linenoise *in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffff;
  char cVar6;
  
  switch(in_SIL) {
  case '\x01':
    cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
    break;
  case '\x02':
    cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
    break;
  case '\x03':
  case '\a':
    CancelSearch(in_RDI);
    cVar6 = '\0';
    break;
  case '\x04':
    cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
    break;
  case '\x05':
  case '\t':
    cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
    break;
  case '\x06':
    cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
    break;
  case '\b':
  case '\x17':
  case '\x7f':
    while( true ) {
      uVar2 = ::std::__cxx11::string::empty();
      bVar5 = false;
      if ((uVar2 & 1) == 0) {
        pcVar3 = (char *)::std::__cxx11::string::back();
        bVar5 = ((int)*pcVar3 & 0xc0U) == 0x80;
      }
      if (!bVar5) break;
      ::std::__cxx11::string::pop_back();
    }
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      ::std::__cxx11::string::pop_back();
    }
    PerformSearch(in_stack_00000120);
    goto LAB_001fad0d;
  case '\n':
  case '\r':
    cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
    break;
  case '\v':
    cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
    break;
  case '\f':
    linenoiseClearScreen();
    goto LAB_001fad0d;
  case '\x0e':
    SearchNext(in_stack_ffffffffffffffd0);
    goto LAB_001fad0d;
  default:
    ::std::__cxx11::string::operator+=((string *)&in_RDI->search_buf,in_SIL);
    PerformSearch(in_stack_00000120);
    goto LAB_001fad0d;
  case '\x10':
    SearchPrev(in_stack_ffffffffffffffd0);
    goto LAB_001fad0d;
  case '\x12':
  case '\x13':
    SearchNext(in_stack_ffffffffffffffd0);
LAB_001fad0d:
    RefreshSearch(in_stack_00000370);
    cVar6 = '\0';
    break;
  case '\x14':
    cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
    break;
  case '\x15':
    cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
    break;
  case '\x1b':
    EVar1 = Terminal::ReadEscapeSequence(in_stack_000001c0);
    this_00 = (Linenoise *)(ulong)(EVar1 - HOME);
    switch(this_00) {
    case (Linenoise *)0x0:
      cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
      break;
    case (Linenoise *)0x1:
      cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
      break;
    case (Linenoise *)0x2:
      SearchPrev(this_00);
      goto LAB_001fad0d;
    case (Linenoise *)0x3:
      SearchNext(this_00);
      goto LAB_001fad0d;
    case (Linenoise *)0x4:
      cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
      break;
    case (Linenoise *)0x5:
      cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
      break;
    default:
      goto LAB_001fad0d;
    case (Linenoise *)0x8:
      cVar6 = AcceptSearch(unaff_retaddr,in_stack_ffffffffffffffff);
    }
  }
  return cVar6;
}

Assistant:

char Linenoise::Search(char c) {
	switch (c) {
	case CTRL_J:
	case ENTER: /* enter */
		// accept search and run
		return AcceptSearch(ENTER);
	case CTRL_R:
	case CTRL_S:
		// move to the next match index
		SearchNext();
		break;
	case ESC: /* escape sequence */ {
		auto escape = Terminal::ReadEscapeSequence(ifd);
		switch (escape) {
		case EscapeSequence::ESCAPE:
			// double escape accepts search without any additional command
			return AcceptSearch(0);
		case EscapeSequence::UP:
			SearchPrev();
			break;
		case EscapeSequence::DOWN:
			SearchNext();
			break;
		case EscapeSequence::HOME:
			return AcceptSearch(CTRL_A);
		case EscapeSequence::END:
			return AcceptSearch(CTRL_E);
		case EscapeSequence::LEFT:
			return AcceptSearch(CTRL_B);
		case EscapeSequence::RIGHT:
			return AcceptSearch(CTRL_F);
		default:
			break;
		}
		break;
	}
	case CTRL_A: // accept search, move to start of line
		return AcceptSearch(CTRL_A);
	case '\t':
	case CTRL_E: // accept search - move to end of line
		return AcceptSearch(CTRL_E);
	case CTRL_B: // accept search - move cursor left
		return AcceptSearch(CTRL_B);
	case CTRL_F: // accept search - move cursor right
		return AcceptSearch(CTRL_F);
	case CTRL_T: // accept search: swap character
		return AcceptSearch(CTRL_T);
	case CTRL_U: // accept search, clear buffer
		return AcceptSearch(CTRL_U);
	case CTRL_K: // accept search, clear after cursor
		return AcceptSearch(CTRL_K);
	case CTRL_D: // accept search, delete a character
		return AcceptSearch(CTRL_D);
	case CTRL_L:
		linenoiseClearScreen();
		break;
	case CTRL_P:
		SearchPrev();
		break;
	case CTRL_N:
		SearchNext();
		break;
	case CTRL_C:
	case CTRL_G:
		// abort search
		CancelSearch();
		return 0;
	case BACKSPACE: /* backspace */
	case CTRL_H:    /* ctrl-h */
	case CTRL_W:    /* ctrl-w */
		// remove trailing UTF-8 bytes (if any)
		while (!search_buf.empty() && ((search_buf.back() & 0xc0) == 0x80)) {
			search_buf.pop_back();
		}
		// finally remove the first UTF-8 byte
		if (!search_buf.empty()) {
			search_buf.pop_back();
		}
		PerformSearch();
		break;
	default:
		// add input to search buffer
		search_buf += c;
		// perform the search
		PerformSearch();
		break;
	}
	RefreshSearch();
	return 0;
}